

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O1

ChannelList *
anon_unknown.dwarf_1c1307::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,PixelType *pt,
          FrameBuffer *buf,bool writing)

{
  _Rb_tree_header *p_Var1;
  Channel *pCVar2;
  Slice *pSVar3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  PixelType PVar10;
  undefined4 *puVar11;
  vector<char,_std::allocator<char>_> *this;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Vec2 *pVVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  Channel local_68 [56];
  
  puVar6 = (undefined8 *)Imf_3_4::Header::dataWindow();
  local_78 = *puVar6;
  uStack_70 = puVar6[1];
  lVar12 = -1;
  lVar17 = 4;
  do {
    lVar17 = lVar17 + -4;
    lVar7 = lVar12 + 1;
    lVar12 = lVar12 + 1;
  } while (channels[lVar7] != (char *)0x0);
  lVar7 = Imf_3_4::Header::dataWindow();
  iVar5 = *(int *)(lVar7 + 8);
  piVar8 = (int *)Imf_3_4::Header::dataWindow();
  lVar13 = (long)((iVar5 - *piVar8) + 1);
  lVar7 = Imf_3_4::Header::dataWindow();
  iVar5 = *(int *)(lVar7 + 0xc);
  lVar7 = Imf_3_4::Header::dataWindow();
  lVar7 = (long)((iVar5 - *(int *)(lVar7 + 4)) + 1);
  lVar14 = lVar12 * lVar13 * lVar7;
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,lVar14 * 4);
  if (lVar14 != 0) {
    puVar6 = &(anonymous_namespace)::readingBuffer;
    if (writing) {
      puVar6 = &(anonymous_namespace)::writingBuffer;
    }
    puVar11 = (undefined4 *)*puVar6;
    lVar14 = 0;
    lVar15 = 0;
LAB_0016d240:
    do {
      uVar4 = random_int(0xffff);
      if ((~uVar4 & 0x7c00) == 0) {
        if ((uVar4 & 0x3ff) != 0) goto LAB_0016d240;
      }
      if ((pt == (PixelType *)0x0) || (pt[lVar14] == HALF)) {
        *(short *)puVar11 = (short)uVar4;
      }
      else {
        *puVar11 = *(undefined4 *)(_imath_half_to_float_table + (ulong)(uVar4 & 0xffff) * 4);
      }
      lVar9 = lVar12 - lVar14;
      lVar14 = lVar14 + 1;
      puVar11 = puVar11 + 1;
      if (lVar9 == 1) {
        lVar14 = 0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar13 * lVar7 * lVar12);
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (lVar12 != 0) {
    iVar5 = ((int)uStack_70 - (int)local_78) + 1;
    puVar6 = &(anonymous_namespace)::readingBuffer;
    if (writing) {
      puVar6 = &(anonymous_namespace)::writingBuffer;
    }
    pVVar16 = (Vec2 *)*puVar6;
    lVar7 = 0;
    do {
      PVar10 = HALF;
      if (pt != (PixelType *)0x0) {
        PVar10 = pt[lVar7];
      }
      pCVar2 = (Channel *)channels[lVar7];
      Imf_3_4::Channel::Channel(local_68,PVar10,1,1,false);
      Imf_3_4::ChannelList::insert((char *)__return_storage_ptr__,pCVar2);
      pSVar3 = (Slice *)channels[lVar7];
      auVar18._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar18._0_8_ = lVar7;
      auVar18._12_4_ = 0x45300000;
      Imf_3_4::Slice::Make
                ((PixelType)local_68,(void *)(ulong)PVar10,pVVar16,(long)&local_78,(long)iVar5,1,
                 -lVar17,(int)-lVar17 * iVar5,1,
                 (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) + 100.0,true,false);
      Imf_3_4::FrameBuffer::insert((char *)buf,pSVar3);
      pVVar16 = pVVar16 + 4;
      lVar7 = lVar7 + 1;
    } while (lVar12 != lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const PixelType*   pt,
    FrameBuffer&       buf,    // buffer to fill with pointers to channel
    bool               writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    size_t activechans = 0;

    while (channels[activechans] != NULL)
    {
        activechans++;
    }

    size_t samples =
        size_t (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
        size_t (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
        activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size = samples * 4;

    if (writing) { writingBuffer.resize (size); }
    else { readingBuffer.resize (size); }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halves, casting to floats for float channels - don't write NaN values
    size_t chan = 0;
    for (size_t i = 0; i < samples; i++)
    {

        half v;
        do
        {
            unsigned short int values =
                random_int (std::numeric_limits<unsigned short>::max ());
            v.setBits (values);
        } while (v.isNan ());

        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
        }
        else { *(float*) write_ptr = float (v); }
        chan++;
        write_ptr += 4;
        if (chan == activechans) { chan = 0; }
    }

    ChannelList chanlist;

    int64_t width         = (dw.max.x + 1 - dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;

    const char* offset =
        (writing ? writingBuffer.data () : readingBuffer.data ());
    for (size_t i = 0; i < activechans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];

        chanlist.insert (channels[i], type);
        buf.insert (
            channels[i],
            Slice::Make (
                type,
                offset,
                dw.min,
                width,
                1,
                activechans * 4,
                bytes_per_row,
                1,
                1,
                100. + i,
                false,
                false));
        offset += 4;
    }

    return chanlist;
}